

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

int __thiscall cppcms::http::impl::file_buffer::underflow(file_buffer *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  reference __ptr;
  char_type *__c;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t n;
  char *input_data;
  size_t read_size;
  size_type in_stack_ffffffffffffffc8;
  int_type local_4;
  
  if ((in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 & 1) == 0) {
    iVar1 = (**(code **)(*(long *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                        + 0x30))();
    if (iVar1 < 0) {
      return -1;
    }
    lVar2 = std::streambuf::gptr();
    lVar3 = std::streambuf::eback();
    *(long *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl =
         (lVar2 - lVar3) +
         *(long *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl;
    iVar1 = fseeko64(*(FILE **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl,
                     *(__off64_t *)
                      &in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl,0);
    if (iVar1 != 0) {
      return -1;
    }
    std::vector<char,_std::allocator<char>_>::resize(in_RDI,in_stack_ffffffffffffffc8);
    __ptr = std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)
                       &in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8,
                       0);
    fread(__ptr,1,0x400,*(FILE **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl
         );
    std::streambuf::setg((char *)in_RDI,__ptr,__ptr);
  }
  else {
    lVar2 = std::streambuf::gptr();
    lVar3 = std::streambuf::eback();
    pcVar4 = (char *)std::streambuf::pbase();
    lVar5 = std::streambuf::pbase();
    pcVar6 = (char *)(lVar5 + (lVar2 - lVar3));
    std::streambuf::pptr();
    std::streambuf::setg((char *)in_RDI,pcVar4,pcVar6);
  }
  lVar2 = std::streambuf::gptr();
  lVar3 = std::streambuf::egptr();
  if (lVar2 == lVar3) {
    local_4 = -1;
  }
  else {
    __c = (char_type *)std::streambuf::gptr();
    local_4 = std::char_traits<char>::to_int_type(__c);
  }
  return local_4;
}

Assistant:

int underflow()
	{
		if(in_memory_) {
			size_t read_size = gptr() - eback();
			setg(pbase(),pbase()+read_size,pptr());
		}
		else {
			if(sync() < 0)
				return -1;
			read_offset_ += gptr() - eback();
			if(fseeko(f_,read_offset_,SEEK_SET)!=0)
				return -1;
			input_.resize(buffer_size);
			char *input_data = &input_[0];
			size_t n = fread(input_data,1,buffer_size,f_);
			setg(input_data,input_data,input_data+n);
		}
		if(gptr()==egptr())
			return -1;
		return std::char_traits<char>::to_int_type(*gptr());
	}